

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

int send_doc(curl_socket_t sock,httprequest *req)

{
  undefined1 uVar1;
  __pid_t _Var2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  FILE *__s;
  uint *puVar8;
  int *piVar9;
  char *pcVar10;
  bool bVar11;
  bool bVar12;
  uint local_160;
  int local_15c;
  int num_1;
  int quarters_1;
  char command [32];
  char *pcStack_130;
  int quarters;
  size_t num;
  char *section;
  char *filename;
  char partbuf [80];
  char msgbuf [64];
  size_t msglen;
  char *responsedump;
  int res;
  int error;
  size_t responsesize;
  _Bool sendfailure;
  _Bool persistant;
  FILE *dump;
  size_t cmdsize;
  char *cmd;
  FILE *stream;
  char *ptr;
  char *buffer;
  size_t count;
  ssize_t written;
  httprequest *req_local;
  curl_socket_t sock_local;
  
  stream = (FILE *)0x0;
  cmdsize = 0;
  dump = (FILE *)0x0;
  uVar1 = 1;
  bVar12 = false;
  pcVar5 = "log/server.response";
  if (is_proxy) {
    pcVar5 = "log/proxy.response";
  }
  iVar4 = req->rcmd;
  written = (ssize_t)req;
  req_local._0_4_ = sock;
  if (iVar4 != 0) {
    if (iVar4 == 1) {
      return 0;
    }
    if (iVar4 == 2) {
      buffer = (char *)0x1f;
      do {
        count = send((curl_socket_t)req_local,"a string to stream 01234567890\n",(size_t)buffer,
                     0x4000);
        if (got_exit_signal != 0) {
          return -1;
        }
      } while ((char *)count == buffer);
      logmsg("Stopped streaming");
      return -1;
    }
  }
  req->open = false;
  if (req->testno < 0) {
    if (req->testno == -3) {
      logmsg("Replying to QUIT");
      ptr = docquit;
    }
    else if (req->testno == -2) {
      logmsg("Identifying ourselves as friends");
      _Var2 = getpid();
      curl_msnprintf(partbuf + 0x48,0x40,"WE ROOLZ: %ld\r\n",(long)_Var2);
      sVar6 = strlen(partbuf + 0x48);
      if ((use_gopher & 1U) == 0) {
        curl_msnprintf(send_doc::weare,0x100,"HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s",
                       sVar6,partbuf + 0x48);
      }
      else {
        curl_msnprintf(send_doc::weare,0x100,"%s",partbuf + 0x48);
      }
      ptr = send_doc::weare;
    }
    else {
      logmsg("Replying to with a 404");
      ptr = doc404;
    }
    buffer = (char *)strlen(ptr);
  }
  else {
    pcVar7 = test2file(req->testno);
    pcVar10 = "data";
    if ((*(byte *)(written + 150000) & 1) != 0) {
      pcVar10 = "connect";
    }
    if (*(long *)(written + 0x24a10) == 0) {
      curl_msnprintf((char *)&filename,0x50,"%s",pcVar10);
    }
    else {
      curl_msnprintf((char *)&filename,0x50,"%s%ld",pcVar10,*(undefined8 *)(written + 0x24a10));
    }
    logmsg("Send response test%ld section <%s>",*(undefined8 *)(written + 0x24a08),&filename);
    cmd = (char *)fopen64(pcVar7,"rb");
    if ((FILE *)cmd == (FILE *)0x0) {
      puVar8 = (uint *)__errno_location();
      uVar3 = *puVar8;
      pcVar5 = strerror(uVar3);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar3,pcVar5);
      logmsg("  [3] Error opening file: %s",pcVar7);
      return 0;
    }
    uVar3 = getpart((char **)&stream,(size_t *)&buffer,"reply",(char *)&filename,(FILE *)cmd);
    fclose((FILE *)cmd);
    if (uVar3 != 0) {
      logmsg("getpart() failed with error: %d",(ulong)uVar3);
      return 0;
    }
    ptr = (char *)stream;
    if (got_exit_signal != 0) {
      free(stream);
      return -1;
    }
    cmd = (char *)fopen64(pcVar7,"rb");
    if ((FILE *)cmd == (FILE *)0x0) {
      puVar8 = (uint *)__errno_location();
      uVar3 = *puVar8;
      pcVar5 = strerror(uVar3);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar3,pcVar5);
      logmsg("  [4] Error opening file: %s",pcVar7);
      free(stream);
      return 0;
    }
    uVar3 = getpart((char **)&cmdsize,(size_t *)&dump,"reply","postcmd",(FILE *)cmd);
    fclose((FILE *)cmd);
    if (uVar3 != 0) {
      logmsg("getpart() failed with error: %d",(ulong)uVar3);
      free(stream);
      return 0;
    }
  }
  responsedump._4_4_ = 0;
  if (got_exit_signal == 0) {
    pcVar7 = strstr(ptr,"swsclose");
    if ((pcVar7 != (char *)0x0) || (buffer == (char *)0x0)) {
      uVar1 = 0;
      logmsg("connection close instruction \"swsclose\" found in response");
    }
    pcVar7 = strstr(ptr,"swsbounce");
    if (pcVar7 == (char *)0x0) {
      prevbounce = false;
    }
    else {
      prevbounce = true;
      logmsg("enable \"swsbounce\" in the next request");
    }
    __s = fopen64(pcVar5,"ab");
    pcVar7 = buffer;
    if (__s == (FILE *)0x0) {
      puVar8 = (uint *)__errno_location();
      uVar3 = *puVar8;
      pcVar7 = strerror(uVar3);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar3,pcVar7);
      logmsg("  [5] Error opening file: %s",pcVar5);
      free(stream);
      free((void *)cmdsize);
      req_local._4_4_ = -1;
    }
    else {
      do {
        pcStack_130 = buffer;
        if ((char *)0xc8 < buffer) {
          pcStack_130 = (char *)0xc8;
        }
        while (count = send((curl_socket_t)req_local,ptr,(size_t)pcStack_130,0x4000),
              (long)count < 0) {
          piVar9 = __errno_location();
          if ((*piVar9 != 0xb) && (piVar9 = __errno_location(), *piVar9 != 0xb)) {
            bVar12 = true;
            goto LAB_00109692;
          }
          wait_ms(10);
        }
        logmsg("Sent off %zd bytes",count);
        fwrite(ptr,1,count,__s);
        buffer = buffer + -count;
        ptr = ptr + count;
        if (*(int *)(written + 0x24a2c) != 0) {
          command._28_4_ = *(int *)(written + 0x24a2c) << 2;
          logmsg("Pausing %d seconds",(ulong)*(uint *)(written + 0x24a2c));
          while (0 < (int)command._28_4_ && got_exit_signal == 0) {
            command._28_4_ = command._28_4_ + -1;
            wait_ms(0xfa);
          }
        }
      } while (buffer != (char *)0x0 && got_exit_signal == 0);
LAB_00109692:
      do {
        iVar4 = fclose(__s);
        bVar11 = false;
        if (iVar4 != 0) {
          puVar8 = (uint *)__errno_location();
          responsedump._4_4_ = *puVar8;
          bVar11 = responsedump._4_4_ == 4;
        }
      } while (bVar11);
      if (iVar4 != 0) {
        pcVar10 = strerror(responsedump._4_4_);
        logmsg("Error closing file %s error: %d %s",pcVar5,(ulong)responsedump._4_4_,pcVar10);
      }
      if (got_exit_signal == 0) {
        if (bVar12) {
          logmsg("Sending response failed. Only (%zu bytes) of (%zu bytes) were sent",
                 (long)pcVar7 - (long)buffer,pcVar7);
          free(stream);
          free((void *)cmdsize);
          req_local._4_4_ = -1;
        }
        else {
          logmsg("Response sent (%zu bytes) and written to %s",pcVar7,pcVar5);
          free(stream);
          if (dump != (FILE *)0x0) {
            stream = (FILE *)cmdsize;
            do {
              iVar4 = __isoc99_sscanf(stream,"%31s %d",&num_1,&local_160);
              if (iVar4 == 2) {
                iVar4 = strcmp("wait",(char *)&num_1);
                if (iVar4 == 0) {
                  logmsg("Told to sleep for %d seconds",(ulong)local_160);
                  local_15c = local_160 << 2;
                  do {
                    if (local_15c < 1 || got_exit_signal != 0) goto LAB_0010989f;
                    local_15c = local_15c + -1;
                    iVar4 = wait_ms(0xfa);
                  } while (iVar4 == 0);
                  puVar8 = (uint *)__errno_location();
                  uVar3 = *puVar8;
                  pcVar5 = strerror(uVar3);
                  logmsg("wait_ms() failed with error: (%d) %s",(ulong)uVar3,pcVar5);
LAB_0010989f:
                  if (local_15c == 0) {
                    logmsg("Continuing after sleeping %d seconds",(ulong)local_160);
                  }
                }
                else {
                  logmsg("Unknown command in reply command section");
                }
              }
              pcVar5 = strchr((char *)stream,10);
              if (pcVar5 == (char *)0x0) {
                stream = (FILE *)0x0;
              }
              else {
                stream = (FILE *)(pcVar5 + 1);
              }
              bVar12 = false;
              if (stream != (FILE *)0x0) {
                bVar12 = (char)stream->_flags != '\0';
              }
            } while (bVar12);
          }
          free((void *)cmdsize);
          if ((use_gopher & 1U) != 0) {
            uVar1 = 0;
          }
          *(undefined1 *)(written + 0x24a18) = uVar1;
          prevtestno = *(long *)(written + 0x24a08);
          prevpartno = *(long *)(written + 0x24a10);
          req_local._4_4_ = 0;
        }
      }
      else {
        free(stream);
        free((void *)cmdsize);
        req_local._4_4_ = -1;
      }
    }
  }
  else {
    free(stream);
    free((void *)cmdsize);
    req_local._4_4_ = -1;
  }
  return req_local._4_4_;
}

Assistant:

static int send_doc(curl_socket_t sock, struct httprequest *req)
{
  ssize_t written;
  size_t count;
  const char *buffer;
  char *ptr=NULL;
  FILE *stream;
  char *cmd=NULL;
  size_t cmdsize=0;
  FILE *dump;
  bool persistant = TRUE;
  bool sendfailure = FALSE;
  size_t responsesize;
  int error = 0;
  int res;
  const char *responsedump = is_proxy?RESPONSE_PROXY_DUMP:RESPONSE_DUMP;
  static char weare[256];

  switch(req->rcmd) {
  default:
  case RCMD_NORMALREQ:
    break; /* continue with business as usual */
  case RCMD_STREAM:
#define STREAMTHIS "a string to stream 01234567890\n"
    count = strlen(STREAMTHIS);
    for(;;) {
      written = swrite(sock, STREAMTHIS, count);
      if(got_exit_signal)
        return -1;
      if(written != (ssize_t)count) {
        logmsg("Stopped streaming");
        break;
      }
    }
    return -1;
  case RCMD_IDLE:
    /* Do nothing. Sit idle. Pretend it rains. */
    return 0;
  }

  req->open = FALSE;

  if(req->testno < 0) {
    size_t msglen;
    char msgbuf[64];

    switch(req->testno) {
    case DOCNUMBER_QUIT:
      logmsg("Replying to QUIT");
      buffer = docquit;
      break;
    case DOCNUMBER_WERULEZ:
      /* we got a "friends?" question, reply back that we sure are */
      logmsg("Identifying ourselves as friends");
      snprintf(msgbuf, sizeof(msgbuf), "WE ROOLZ: %ld\r\n", (long)getpid());
      msglen = strlen(msgbuf);
      if(use_gopher)
        snprintf(weare, sizeof(weare), "%s", msgbuf);
      else
        snprintf(weare, sizeof(weare),
                 "HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s",
                 msglen, msgbuf);
      buffer = weare;
      break;
    case DOCNUMBER_404:
    default:
      logmsg("Replying to with a 404");
      buffer = doc404;
      break;
    }

    count = strlen(buffer);
  }
  else {
    char partbuf[80];
    char *filename = test2file(req->testno);

    /* select the <data> tag for "normal" requests and the <connect> one
       for CONNECT requests (within the <reply> section) */
    const char *section= req->connect_request?"connect":"data";

    if(req->partno)
      snprintf(partbuf, sizeof(partbuf), "%s%ld", section, req->partno);
    else
      snprintf(partbuf, sizeof(partbuf), "%s", section);

    logmsg("Send response test%ld section <%s>", req->testno, partbuf);

    stream=fopen(filename, "rb");
    if(!stream) {
      error = errno;
      logmsg("fopen() failed with error: %d %s", error, strerror(error));
      logmsg("  [3] Error opening file: %s", filename);
      return 0;
    }
    else {
      error = getpart(&ptr, &count, "reply", partbuf, stream);
      fclose(stream);
      if(error) {
        logmsg("getpart() failed with error: %d", error);
        return 0;
      }
      buffer = ptr;
    }

    if(got_exit_signal) {
      free(ptr);
      return -1;
    }

    /* re-open the same file again */
    stream=fopen(filename, "rb");
    if(!stream) {
      error = errno;
      logmsg("fopen() failed with error: %d %s", error, strerror(error));
      logmsg("  [4] Error opening file: %s", filename);
      free(ptr);
      return 0;
    }
    else {
      /* get the custom server control "commands" */
      error = getpart(&cmd, &cmdsize, "reply", "postcmd", stream);
      fclose(stream);
      if(error) {
        logmsg("getpart() failed with error: %d", error);
        free(ptr);
        return 0;
      }
    }
  }

  if(got_exit_signal) {
    free(ptr);
    free(cmd);
    return -1;
  }

  /* If the word 'swsclose' is present anywhere in the reply chunk, the
     connection will be closed after the data has been sent to the requesting
     client... */
  if(strstr(buffer, "swsclose") || !count) {
    persistant = FALSE;
    logmsg("connection close instruction \"swsclose\" found in response");
  }
  if(strstr(buffer, "swsbounce")) {
    prevbounce = TRUE;
    logmsg("enable \"swsbounce\" in the next request");
  }
  else
    prevbounce = FALSE;

  dump = fopen(responsedump, "ab");
  if(!dump) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("  [5] Error opening file: %s", responsedump);
    free(ptr);
    free(cmd);
    return -1;
  }

  responsesize = count;
  do {
    /* Ok, we send no more than 200 bytes at a time, just to make sure that
       larger chunks are split up so that the client will need to do multiple
       recv() calls to get it and thus we exercise that code better */
    size_t num = count;
    if(num > 200)
      num = 200;

    retry:
    written = swrite(sock, buffer, num);
    if(written < 0) {
      if((EWOULDBLOCK == SOCKERRNO) || (EAGAIN == SOCKERRNO)) {
        wait_ms(10);
        goto retry;
      }
      sendfailure = TRUE;
      break;
    }
    else {
      logmsg("Sent off %zd bytes", written);
    }

    /* write to file as well */
    fwrite(buffer, 1, (size_t)written, dump);

    count -= written;
    buffer += written;

    if(req->writedelay) {
      int quarters = req->writedelay * 4;
      logmsg("Pausing %d seconds", req->writedelay);
      while((quarters > 0) && !got_exit_signal) {
        quarters--;
        wait_ms(250);
      }
    }
  } while((count > 0) && !got_exit_signal);

  do {
    res = fclose(dump);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error closing file %s error: %d %s",
           responsedump, error, strerror(error));

  if(got_exit_signal) {
    free(ptr);
    free(cmd);
    return -1;
  }

  if(sendfailure) {
    logmsg("Sending response failed. Only (%zu bytes) of (%zu bytes) "
           "were sent",
           responsesize-count, responsesize);
    free(ptr);
    free(cmd);
    return -1;
  }

  logmsg("Response sent (%zu bytes) and written to %s",
         responsesize, responsedump);
  free(ptr);

  if(cmdsize > 0) {
    char command[32];
    int quarters;
    int num;
    ptr=cmd;
    do {
      if(2 == sscanf(ptr, "%31s %d", command, &num)) {
        if(!strcmp("wait", command)) {
          logmsg("Told to sleep for %d seconds", num);
          quarters = num * 4;
          while((quarters > 0) && !got_exit_signal) {
            quarters--;
            res = wait_ms(250);
            if(res) {
              /* should not happen */
              error = errno;
              logmsg("wait_ms() failed with error: (%d) %s",
                     error, strerror(error));
              break;
            }
          }
          if(!quarters)
            logmsg("Continuing after sleeping %d seconds", num);
        }
        else
          logmsg("Unknown command in reply command section");
      }
      ptr = strchr(ptr, '\n');
      if(ptr)
        ptr++;
      else
        ptr = NULL;
    } while(ptr && *ptr);
  }
  free(cmd);
  req->open = use_gopher?FALSE:persistant;

  prevtestno = req->testno;
  prevpartno = req->partno;

  return 0;
}